

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_listener_set_proto(void *arg,void *buf,size_t sz,nni_type t)

{
  char *pcVar1;
  char *ns;
  int rv;
  nni_ws_listener *l;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  ns._4_4_ = ws_check_string(buf,sz,t);
  if (ns._4_4_ == 0) {
    pcVar1 = nni_strdup((char *)buf);
    if (pcVar1 == (char *)0x0) {
      ns._4_4_ = 2;
    }
    else {
      nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
      if (*(long *)((long)arg + 0x58) != 0) {
        nni_strfree(*(char **)((long)arg + 0x58));
      }
      *(char **)((long)arg + 0x58) = pcVar1;
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
    }
  }
  return ns._4_4_;
}

Assistant:

static int
ws_listener_set_proto(void *arg, const void *buf, size_t sz, nni_type t)
{
	nni_ws_listener *l = arg;
	int              rv;

	if ((rv = ws_check_string(buf, sz, t)) == 0) {
		char *ns;
		if ((ns = nni_strdup(buf)) == NULL) {
			rv = NNG_ENOMEM;
		} else {
			nni_mtx_lock(&l->mtx);
			if (l->proto != NULL) {
				nni_strfree(l->proto);
			}
			l->proto = ns;
			nni_mtx_unlock(&l->mtx);
		}
	}
	return (rv);
}